

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_color_fv(float *c,nk_color in)

{
  nk_color_f(c,c + 1,c + 2,c + 3,in);
  return;
}

Assistant:

NK_API void
nk_color_fv(float *c, struct nk_color in)
{
    nk_color_f(&c[0], &c[1], &c[2], &c[3], in);
}